

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning_tree.cc
# Opt level: O2

void __thiscall VW::SpanningTree::Start(SpanningTree *this)

{
  future<void> *pfVar1;
  future<void> local_30;
  SpanningTree *local_20;
  undefined8 local_18;
  
  if (this->m_future == (future<void> *)0x0) {
    pfVar1 = (future<void> *)operator_new(0x10);
    (pfVar1->super___basic_future<void>)._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pfVar1->super___basic_future<void>)._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this->m_future = pfVar1;
  }
  local_20 = (SpanningTree *)Run;
  local_18 = 0;
  std::async<void(VW::SpanningTree::*)(),VW::SpanningTree*>((launch)&local_30,(type *)0x1,&local_20)
  ;
  std::future<void>::operator=(this->m_future,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void SpanningTree::Start()
{
  // launch async
  if (m_future == nullptr)
  {
    m_future = new future<void>;
  }

  *m_future = std::async(std::launch::async, &SpanningTree::Run, this);
}